

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void fdct64_avx2(__m256i *input,__m256i *output,int8_t cos_bit,int instride,int outstride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 (*pauVar4) [32];
  undefined1 (*pauVar5) [32];
  undefined8 *puVar6;
  int in_ECX;
  char in_DL;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  __m256i x2 [64];
  __m256i x1 [64];
  int endidx;
  int startidx;
  __m256i cospi_p40;
  __m256i cospi_p08;
  __m256i cospi_m24;
  __m256i cospi_p24;
  __m256i cospi_m40;
  __m256i cospi_m56;
  __m256i cospi_p56;
  __m256i cospi_m08;
  __m256i cospi_p16;
  __m256i cospi_m48;
  __m256i cospi_p48;
  __m256i cospi_m16;
  __m256i cospi_p32;
  __m256i cospi_m32;
  __m256i __rounding;
  int32_t *cospi;
  undefined8 in_stack_ffffffffffffd910;
  undefined4 uVar8;
  __m256i *palVar7;
  int8_t in_stack_ffffffffffffd918;
  __m256i *cospi_p24_00;
  undefined4 in_stack_ffffffffffffd944;
  int8_t in_stack_ffffffffffffd948;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined7 uStack_24f8;
  int8_t in_stack_ffffffffffffdb0f;
  __m256i *in_stack_ffffffffffffdb10;
  __m256i *in_stack_ffffffffffffdb18;
  __m256i *in_stack_ffffffffffffdb20;
  __m256i *in_stack_ffffffffffffdb28;
  __m256i *in_stack_ffffffffffffdb30;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  __m256i *in_stack_ffffffffffffdb88;
  __m256i *in_stack_ffffffffffffdb90;
  __m256i *in_stack_ffffffffffffdb98;
  __m256i *in_stack_ffffffffffffdba0;
  __m256i *in_stack_ffffffffffffdba8;
  __m256i *in_stack_ffffffffffffdbb0;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  __m256i *in_stack_ffffffffffffdc08;
  __m256i *in_stack_ffffffffffffdc10;
  __m256i *in_stack_ffffffffffffdc18;
  __m256i *in_stack_ffffffffffffdc20;
  __m256i *in_stack_ffffffffffffdc28;
  __m256i *in_stack_ffffffffffffdc30;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined7 uStack_22f8;
  int8_t in_stack_ffffffffffffdd0f;
  __m256i *in_stack_ffffffffffffdd10;
  __m256i *in_stack_ffffffffffffdd18;
  __m256i *in_stack_ffffffffffffdd20;
  __m256i *in_stack_ffffffffffffdd28;
  __m256i *in_stack_ffffffffffffdd30;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  __m256i *in_stack_ffffffffffffde08;
  __m256i *in_stack_ffffffffffffde10;
  __m256i *in_stack_ffffffffffffde18;
  __m256i *in_stack_ffffffffffffde20;
  __m256i *in_stack_ffffffffffffde28;
  __m256i *in_stack_ffffffffffffde30;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  __m256i *in_stack_ffffffffffffdf08;
  __m256i *in_stack_ffffffffffffdf10;
  __m256i *in_stack_ffffffffffffdf18;
  __m256i *in_stack_ffffffffffffdf20;
  __m256i *in_stack_ffffffffffffdf28;
  __m256i *in_stack_ffffffffffffdf30;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined7 uStack_20b0;
  int8_t in_stack_ffffffffffffdf57;
  __m256i *in_stack_ffffffffffffdf58;
  int32_t *in_stack_ffffffffffffdf60;
  __m256i *in_stack_ffffffffffffdf68;
  __m256i *in_stack_ffffffffffffdf70;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined7 uStack_1eb0;
  int8_t in_stack_ffffffffffffe157;
  __m256i *in_stack_ffffffffffffe158;
  undefined1 auVar9 [24];
  unkbyte9 Var10;
  undefined1 auVar11 [24];
  longlong local_1640;
  longlong lStack_1638;
  longlong lStack_1630;
  longlong lStack_1628;
  longlong local_1620;
  longlong lStack_1618;
  longlong lStack_1610;
  longlong lStack_1608;
  longlong local_1600;
  longlong lStack_15f8;
  longlong lStack_15f0;
  longlong lStack_15e8;
  longlong local_15e0;
  longlong lStack_15d8;
  longlong lStack_15d0;
  longlong lStack_15c8;
  longlong local_15c0;
  longlong lStack_15b8;
  longlong lStack_15b0;
  longlong lStack_15a8;
  longlong local_15a0;
  longlong lStack_1598;
  longlong lStack_1590;
  longlong lStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  longlong local_14c0;
  longlong lStack_14b8;
  longlong lStack_14b0;
  longlong lStack_14a8;
  int32_t *local_1488;
  int local_147c;
  int local_1478;
  char local_1471;
  undefined8 *local_1470;
  undefined1 (*local_1468) [32];
  uint local_145c;
  uint local_1458;
  uint local_1454;
  uint local_1450;
  uint local_144c;
  uint local_1448;
  uint local_1444;
  uint local_1440;
  uint local_143c;
  uint local_1438;
  uint local_1434;
  uint local_1430;
  uint local_142c;
  uint local_1428;
  uint local_1424;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined1 local_420 [16];
  undefined1 auStack_410 [16];
  uint local_400;
  uint local_3fc;
  uint local_3f8;
  uint local_3f4;
  uint local_3f0;
  uint local_3ec;
  uint local_3e8;
  uint local_3e4;
  undefined1 local_3e0 [16];
  undefined1 auStack_3d0 [16];
  uint local_3c0;
  uint local_3bc;
  uint local_3b8;
  uint local_3b4;
  uint local_3b0;
  uint local_3ac;
  uint local_3a8;
  uint local_3a4;
  undefined1 local_3a0 [16];
  undefined1 auStack_390 [16];
  uint local_380;
  uint local_37c;
  uint local_378;
  uint local_374;
  uint local_370;
  uint local_36c;
  uint local_368;
  uint local_364;
  undefined1 local_360 [16];
  undefined1 auStack_350 [16];
  uint local_340;
  uint local_33c;
  uint local_338;
  uint local_334;
  uint local_330;
  uint local_32c;
  uint local_328;
  uint local_324;
  undefined1 local_320 [16];
  undefined1 auStack_310 [16];
  uint local_300;
  uint local_2fc;
  uint local_2f8;
  uint local_2f4;
  uint local_2f0;
  uint local_2ec;
  uint local_2e8;
  uint local_2e4;
  undefined1 local_2e0 [16];
  undefined1 auStack_2d0 [16];
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  uint local_2ac;
  uint local_2a8;
  uint local_2a4;
  undefined1 local_2a0 [16];
  undefined1 auStack_290 [16];
  uint local_280;
  uint local_27c;
  uint local_278;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  uint local_264;
  undefined1 local_260 [16];
  undefined1 auStack_250 [16];
  uint local_240;
  uint local_23c;
  uint local_238;
  uint local_234;
  uint local_230;
  uint local_22c;
  uint local_228;
  uint local_224;
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  uint local_200;
  uint local_1fc;
  uint local_1f8;
  uint local_1f4;
  uint local_1f0;
  uint local_1ec;
  uint local_1e8;
  uint local_1e4;
  undefined1 local_1e0 [16];
  undefined1 auStack_1d0 [16];
  uint local_1c0;
  uint local_1bc;
  uint local_1b8;
  uint local_1b4;
  uint local_1b0;
  uint local_1ac;
  uint local_1a8;
  uint local_1a4;
  undefined1 local_1a0 [16];
  undefined1 auStack_190 [16];
  uint local_180;
  uint local_17c;
  uint local_178;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  uint local_164;
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  uint local_140;
  uint local_13c;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  undefined1 local_e0 [16];
  undefined1 auStack_d0 [16];
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  undefined1 local_a0 [32];
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  
  uVar8 = (undefined4)((ulong)in_stack_ffffffffffffd910 >> 0x20);
  local_147c = in_R8D;
  local_1478 = in_ECX;
  local_1471 = in_DL;
  local_1470 = in_RSI;
  local_1468 = in_RDI;
  local_1488 = cospi_arr((int)in_DL);
  local_1424 = 1 << (local_1471 - 1U & 0x1f);
  auVar1 = vpinsrd_avx(ZEXT416(local_1424),local_1424,1);
  auVar1 = vpinsrd_avx(auVar1,local_1424,2);
  local_420 = vpinsrd_avx(auVar1,local_1424,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_1424),local_1424,1);
  auVar1 = vpinsrd_avx(auVar1,local_1424,2);
  auStack_410 = vpinsrd_avx(auVar1,local_1424,3);
  local_14c0 = local_420._0_8_;
  lStack_14b8 = local_420._8_8_;
  lStack_14b0 = auStack_410._0_8_;
  lStack_14a8 = auStack_410._8_8_;
  local_1428 = -local_1488[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(local_1428),local_1428,1);
  auVar1 = vpinsrd_avx(auVar1,local_1428,2);
  local_3e0 = vpinsrd_avx(auVar1,local_1428,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_1428),local_1428,1);
  auVar1 = vpinsrd_avx(auVar1,local_1428,2);
  auStack_3d0 = vpinsrd_avx(auVar1,local_1428,3);
  local_14e0 = local_3e0._0_8_;
  uStack_14d8 = local_3e0._8_8_;
  uStack_14d0 = auStack_3d0._0_8_;
  uStack_14c8 = auStack_3d0._8_8_;
  local_142c = local_1488[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(local_142c),local_142c,1);
  auVar1 = vpinsrd_avx(auVar1,local_142c,2);
  local_3a0 = vpinsrd_avx(auVar1,local_142c,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_142c),local_142c,1);
  auVar1 = vpinsrd_avx(auVar1,local_142c,2);
  auStack_390 = vpinsrd_avx(auVar1,local_142c,3);
  local_1500 = local_3a0._0_8_;
  uStack_14f8 = local_3a0._8_8_;
  uStack_14f0 = auStack_390._0_8_;
  uStack_14e8 = auStack_390._8_8_;
  local_1430 = -local_1488[0x10];
  auVar1 = vpinsrd_avx(ZEXT416(local_1430),local_1430,1);
  auVar1 = vpinsrd_avx(auVar1,local_1430,2);
  local_360 = vpinsrd_avx(auVar1,local_1430,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_1430),local_1430,1);
  auVar1 = vpinsrd_avx(auVar1,local_1430,2);
  auStack_350 = vpinsrd_avx(auVar1,local_1430,3);
  local_1520 = local_360._0_8_;
  uStack_1518 = local_360._8_8_;
  uStack_1510 = auStack_350._0_8_;
  uStack_1508 = auStack_350._8_8_;
  local_1434 = local_1488[0x30];
  auVar1 = vpinsrd_avx(ZEXT416(local_1434),local_1434,1);
  auVar1 = vpinsrd_avx(auVar1,local_1434,2);
  local_320 = vpinsrd_avx(auVar1,local_1434,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_1434),local_1434,1);
  auVar1 = vpinsrd_avx(auVar1,local_1434,2);
  auStack_310 = vpinsrd_avx(auVar1,local_1434,3);
  local_1540 = local_320._0_8_;
  uStack_1538 = local_320._8_8_;
  uStack_1530 = auStack_310._0_8_;
  uStack_1528 = auStack_310._8_8_;
  local_1438 = -local_1488[0x30];
  auVar1 = vpinsrd_avx(ZEXT416(local_1438),local_1438,1);
  auVar1 = vpinsrd_avx(auVar1,local_1438,2);
  local_2e0 = vpinsrd_avx(auVar1,local_1438,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_1438),local_1438,1);
  auVar1 = vpinsrd_avx(auVar1,local_1438,2);
  auStack_2d0 = vpinsrd_avx(auVar1,local_1438,3);
  local_1560 = local_2e0._0_8_;
  uStack_1558 = local_2e0._8_8_;
  uStack_1550 = auStack_2d0._0_8_;
  uStack_1548 = auStack_2d0._8_8_;
  local_143c = local_1488[0x10];
  auVar1 = vpinsrd_avx(ZEXT416(local_143c),local_143c,1);
  auVar1 = vpinsrd_avx(auVar1,local_143c,2);
  local_2a0 = vpinsrd_avx(auVar1,local_143c,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_143c),local_143c,1);
  auVar1 = vpinsrd_avx(auVar1,local_143c,2);
  auStack_290 = vpinsrd_avx(auVar1,local_143c,3);
  local_1580 = local_2a0._0_8_;
  uStack_1578 = local_2a0._8_8_;
  uStack_1570 = auStack_290._0_8_;
  uStack_1568 = auStack_290._8_8_;
  local_1440 = -local_1488[8];
  auVar1 = vpinsrd_avx(ZEXT416(local_1440),local_1440,1);
  auVar1 = vpinsrd_avx(auVar1,local_1440,2);
  local_260 = vpinsrd_avx(auVar1,local_1440,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_1440),local_1440,1);
  auVar1 = vpinsrd_avx(auVar1,local_1440,2);
  auStack_250 = vpinsrd_avx(auVar1,local_1440,3);
  local_15a0 = local_260._0_8_;
  lStack_1598 = local_260._8_8_;
  lStack_1590 = auStack_250._0_8_;
  lStack_1588 = auStack_250._8_8_;
  local_1444 = local_1488[0x38];
  auVar1 = vpinsrd_avx(ZEXT416(local_1444),local_1444,1);
  auVar1 = vpinsrd_avx(auVar1,local_1444,2);
  local_220 = vpinsrd_avx(auVar1,local_1444,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_1444),local_1444,1);
  auVar1 = vpinsrd_avx(auVar1,local_1444,2);
  auStack_210 = vpinsrd_avx(auVar1,local_1444,3);
  local_15c0 = local_220._0_8_;
  lStack_15b8 = local_220._8_8_;
  lStack_15b0 = auStack_210._0_8_;
  lStack_15a8 = auStack_210._8_8_;
  local_1448 = -local_1488[0x38];
  auVar1 = vpinsrd_avx(ZEXT416(local_1448),local_1448,1);
  auVar1 = vpinsrd_avx(auVar1,local_1448,2);
  local_1e0 = vpinsrd_avx(auVar1,local_1448,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_1448),local_1448,1);
  auVar1 = vpinsrd_avx(auVar1,local_1448,2);
  auStack_1d0 = vpinsrd_avx(auVar1,local_1448,3);
  local_15e0 = local_1e0._0_8_;
  lStack_15d8 = local_1e0._8_8_;
  lStack_15d0 = auStack_1d0._0_8_;
  lStack_15c8 = auStack_1d0._8_8_;
  local_144c = -local_1488[0x28];
  auVar1 = vpinsrd_avx(ZEXT416(local_144c),local_144c,1);
  auVar1 = vpinsrd_avx(auVar1,local_144c,2);
  local_1a0 = vpinsrd_avx(auVar1,local_144c,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_144c),local_144c,1);
  auVar1 = vpinsrd_avx(auVar1,local_144c,2);
  auStack_190 = vpinsrd_avx(auVar1,local_144c,3);
  local_1600 = local_1a0._0_8_;
  lStack_15f8 = local_1a0._8_8_;
  lStack_15f0 = auStack_190._0_8_;
  lStack_15e8 = auStack_190._8_8_;
  local_1450 = local_1488[0x18];
  auVar1 = vpinsrd_avx(ZEXT416(local_1450),local_1450,1);
  auVar1 = vpinsrd_avx(auVar1,local_1450,2);
  local_160 = vpinsrd_avx(auVar1,local_1450,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_1450),local_1450,1);
  auVar1 = vpinsrd_avx(auVar1,local_1450,2);
  auStack_150 = vpinsrd_avx(auVar1,local_1450,3);
  local_1620 = local_160._0_8_;
  lStack_1618 = local_160._8_8_;
  lStack_1610 = auStack_150._0_8_;
  lStack_1608 = auStack_150._8_8_;
  local_1454 = -local_1488[0x18];
  auVar1 = vpinsrd_avx(ZEXT416(local_1454),local_1454,1);
  auVar1 = vpinsrd_avx(auVar1,local_1454,2);
  local_120 = vpinsrd_avx(auVar1,local_1454,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_1454),local_1454,1);
  auVar1 = vpinsrd_avx(auVar1,local_1454,2);
  auStack_110 = vpinsrd_avx(auVar1,local_1454,3);
  local_1640 = local_120._0_8_;
  lStack_1638 = local_120._8_8_;
  lStack_1630 = auStack_110._0_8_;
  lStack_1628 = auStack_110._8_8_;
  local_1458 = local_1488[8];
  auVar1 = vpinsrd_avx(ZEXT416(local_1458),local_1458,1);
  auVar1 = vpinsrd_avx(auVar1,local_1458,2);
  local_e0 = vpinsrd_avx(auVar1,local_1458,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_1458),local_1458,1);
  auVar1 = vpinsrd_avx(auVar1,local_1458,2);
  auStack_d0 = vpinsrd_avx(auVar1,local_1458,3);
  local_145c = local_1488[0x28];
  auVar1 = vpinsrd_avx(ZEXT416(local_145c),local_145c,1);
  auVar1 = vpinsrd_avx(auVar1,local_145c,2);
  auVar1 = vpinsrd_avx(auVar1,local_145c,3);
  auVar2 = vpinsrd_avx(ZEXT416(local_145c),local_145c,1);
  auVar2 = vpinsrd_avx(auVar2,local_145c,2);
  auVar2 = vpinsrd_avx(auVar2,local_145c,3);
  local_a0._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  local_a0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_c40 = *(undefined8 *)*local_1468;
  uStack_c38 = *(undefined8 *)(*local_1468 + 8);
  uStack_c30 = *(undefined8 *)(*local_1468 + 0x10);
  uStack_c28 = *(undefined8 *)(*local_1468 + 0x18);
  pauVar4 = local_1468 + local_1478 * 0x3f;
  local_c60 = *(undefined8 *)*pauVar4;
  uStack_c58 = *(undefined8 *)(*pauVar4 + 8);
  uStack_c50 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_c48 = *(undefined8 *)(*pauVar4 + 0x18);
  auVar3 = vpaddd_avx2(*local_1468,*pauVar4);
  auVar9 = auVar3._0_24_;
  local_440 = *(undefined8 *)*local_1468;
  uStack_438 = *(undefined8 *)(*local_1468 + 8);
  uStack_430 = *(undefined8 *)(*local_1468 + 0x10);
  uStack_428 = *(undefined8 *)(*local_1468 + 0x18);
  pauVar4 = local_1468 + local_1478 * 0x3f;
  local_460 = *(undefined8 *)*pauVar4;
  uStack_458 = *(undefined8 *)(*pauVar4 + 8);
  uStack_450 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_448 = *(undefined8 *)(*pauVar4 + 0x18);
  vpsubd_avx2(*local_1468,*pauVar4);
  pauVar4 = local_1468 + local_1478;
  local_c80 = *(undefined8 *)*pauVar4;
  uStack_c78 = *(undefined8 *)(*pauVar4 + 8);
  uStack_c70 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_c68 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x3e;
  local_ca0 = *(undefined8 *)*pauVar5;
  uStack_c98 = *(undefined8 *)(*pauVar5 + 8);
  uStack_c90 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_c88 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478;
  local_480 = *(undefined8 *)*pauVar4;
  uStack_478 = *(undefined8 *)(*pauVar4 + 8);
  uStack_470 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_468 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x3e;
  local_4a0 = *(undefined8 *)*pauVar5;
  uStack_498 = *(undefined8 *)(*pauVar5 + 8);
  uStack_490 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_488 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 2;
  local_cc0 = *(undefined8 *)*pauVar4;
  uStack_cb8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_cb0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_ca8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x3d;
  local_ce0 = *(undefined8 *)*pauVar5;
  uStack_cd8 = *(undefined8 *)(*pauVar5 + 8);
  uStack_cd0 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_cc8 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 2;
  local_4c0 = *(undefined8 *)*pauVar4;
  uStack_4b8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_4b0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_4a8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x3d;
  local_4e0 = *(undefined8 *)*pauVar5;
  uStack_4d8 = *(undefined8 *)(*pauVar5 + 8);
  uStack_4d0 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_4c8 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 3;
  local_d00 = *(undefined8 *)*pauVar4;
  uStack_cf8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_cf0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_ce8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x3c;
  local_d20 = *(undefined8 *)*pauVar5;
  uStack_d18 = *(undefined8 *)(*pauVar5 + 8);
  uStack_d10 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_d08 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 3;
  local_500 = *(undefined8 *)*pauVar4;
  uStack_4f8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_4f0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_4e8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x3c;
  local_520 = *(undefined8 *)*pauVar5;
  uStack_518 = *(undefined8 *)(*pauVar5 + 8);
  uStack_510 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_508 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 4;
  local_d40 = *(undefined8 *)*pauVar4;
  uStack_d38 = *(undefined8 *)(*pauVar4 + 8);
  uStack_d30 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_d28 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x3b;
  local_d60 = *(undefined8 *)*pauVar5;
  uStack_d58 = *(undefined8 *)(*pauVar5 + 8);
  uStack_d50 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_d48 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 4;
  local_540 = *(undefined8 *)*pauVar4;
  uStack_538 = *(undefined8 *)(*pauVar4 + 8);
  uStack_530 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_528 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x3b;
  local_560 = *(undefined8 *)*pauVar5;
  uStack_558 = *(undefined8 *)(*pauVar5 + 8);
  uStack_550 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_548 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 5;
  local_d80 = *(undefined8 *)*pauVar4;
  uStack_d78 = *(undefined8 *)(*pauVar4 + 8);
  uStack_d70 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_d68 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x3a;
  local_da0 = *(undefined8 *)*pauVar5;
  uStack_d98 = *(undefined8 *)(*pauVar5 + 8);
  uStack_d90 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_d88 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 5;
  local_580 = *(undefined8 *)*pauVar4;
  uStack_578 = *(undefined8 *)(*pauVar4 + 8);
  uStack_570 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_568 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x3a;
  local_5a0 = *(undefined8 *)*pauVar5;
  uStack_598 = *(undefined8 *)(*pauVar5 + 8);
  uStack_590 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_588 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 6;
  local_dc0 = *(undefined8 *)*pauVar4;
  uStack_db8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_db0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_da8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x39;
  local_de0 = *(undefined8 *)*pauVar5;
  uStack_dd8 = *(undefined8 *)(*pauVar5 + 8);
  uStack_dd0 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_dc8 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 6;
  local_5c0 = *(undefined8 *)*pauVar4;
  uStack_5b8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_5b0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_5a8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x39;
  local_5e0 = *(undefined8 *)*pauVar5;
  uStack_5d8 = *(undefined8 *)(*pauVar5 + 8);
  uStack_5d0 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_5c8 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 7;
  local_e00 = *(undefined8 *)*pauVar4;
  uStack_df8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_df0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_de8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x38;
  local_e20 = *(undefined8 *)*pauVar5;
  uStack_e18 = *(undefined8 *)(*pauVar5 + 8);
  uStack_e10 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_e08 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 7;
  local_600 = *(undefined8 *)*pauVar4;
  uStack_5f8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_5f0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_5e8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x38;
  local_620 = *(undefined8 *)*pauVar5;
  uStack_618 = *(undefined8 *)(*pauVar5 + 8);
  uStack_610 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_608 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 8;
  local_e40 = *(undefined8 *)*pauVar4;
  uStack_e38 = *(undefined8 *)(*pauVar4 + 8);
  uStack_e30 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_e28 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x37;
  local_e60 = *(undefined8 *)*pauVar5;
  uStack_e58 = *(undefined8 *)(*pauVar5 + 8);
  uStack_e50 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_e48 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 8;
  local_640 = *(undefined8 *)*pauVar4;
  uStack_638 = *(undefined8 *)(*pauVar4 + 8);
  uStack_630 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_628 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x37;
  local_660 = *(undefined8 *)*pauVar5;
  uStack_658 = *(undefined8 *)(*pauVar5 + 8);
  uStack_650 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_648 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 9;
  local_e80 = *(undefined8 *)*pauVar4;
  uStack_e78 = *(undefined8 *)(*pauVar4 + 8);
  uStack_e70 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_e68 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x36;
  local_ea0 = *(undefined8 *)*pauVar5;
  uStack_e98 = *(undefined8 *)(*pauVar5 + 8);
  uStack_e90 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_e88 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 9;
  local_680 = *(undefined8 *)*pauVar4;
  uStack_678 = *(undefined8 *)(*pauVar4 + 8);
  uStack_670 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_668 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x36;
  local_6a0 = *(undefined8 *)*pauVar5;
  uStack_698 = *(undefined8 *)(*pauVar5 + 8);
  uStack_690 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_688 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 10;
  local_ec0 = *(undefined8 *)*pauVar4;
  uStack_eb8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_eb0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_ea8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x35;
  local_ee0 = *(undefined8 *)*pauVar5;
  uStack_ed8 = *(undefined8 *)(*pauVar5 + 8);
  uStack_ed0 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_ec8 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 10;
  local_6c0 = *(undefined8 *)*pauVar4;
  uStack_6b8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_6b0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_6a8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x35;
  local_6e0 = *(undefined8 *)*pauVar5;
  uStack_6d8 = *(undefined8 *)(*pauVar5 + 8);
  uStack_6d0 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_6c8 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0xb;
  local_f00 = *(undefined8 *)*pauVar4;
  uStack_ef8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_ef0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_ee8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x34;
  local_f20 = *(undefined8 *)*pauVar5;
  uStack_f18 = *(undefined8 *)(*pauVar5 + 8);
  uStack_f10 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_f08 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0xb;
  local_700 = *(undefined8 *)*pauVar4;
  uStack_6f8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_6f0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_6e8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x34;
  local_720 = *(undefined8 *)*pauVar5;
  uStack_718 = *(undefined8 *)(*pauVar5 + 8);
  uStack_710 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_708 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0xc;
  local_f40 = *(undefined8 *)*pauVar4;
  uStack_f38 = *(undefined8 *)(*pauVar4 + 8);
  uStack_f30 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_f28 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x33;
  local_f60 = *(undefined8 *)*pauVar5;
  uStack_f58 = *(undefined8 *)(*pauVar5 + 8);
  uStack_f50 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_f48 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0xc;
  local_740 = *(undefined8 *)*pauVar4;
  uStack_738 = *(undefined8 *)(*pauVar4 + 8);
  uStack_730 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_728 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x33;
  local_760 = *(undefined8 *)*pauVar5;
  uStack_758 = *(undefined8 *)(*pauVar5 + 8);
  uStack_750 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_748 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0xd;
  local_f80 = *(undefined8 *)*pauVar4;
  uStack_f78 = *(undefined8 *)(*pauVar4 + 8);
  uStack_f70 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_f68 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x32;
  local_fa0 = *(undefined8 *)*pauVar5;
  uStack_f98 = *(undefined8 *)(*pauVar5 + 8);
  uStack_f90 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_f88 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0xd;
  local_780 = *(undefined8 *)*pauVar4;
  uStack_778 = *(undefined8 *)(*pauVar4 + 8);
  uStack_770 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_768 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x32;
  local_7a0 = *(undefined8 *)*pauVar5;
  uStack_798 = *(undefined8 *)(*pauVar5 + 8);
  uStack_790 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_788 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0xe;
  local_fc0 = *(undefined8 *)*pauVar4;
  uStack_fb8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_fb0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_fa8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x31;
  local_fe0 = *(undefined8 *)*pauVar5;
  uStack_fd8 = *(undefined8 *)(*pauVar5 + 8);
  uStack_fd0 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_fc8 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0xe;
  local_7c0 = *(undefined8 *)*pauVar4;
  uStack_7b8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_7b0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_7a8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x31;
  local_7e0 = *(undefined8 *)*pauVar5;
  uStack_7d8 = *(undefined8 *)(*pauVar5 + 8);
  uStack_7d0 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_7c8 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0xf;
  local_1000 = *(undefined8 *)*pauVar4;
  uStack_ff8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_ff0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_fe8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x30;
  local_1020 = *(undefined8 *)*pauVar5;
  uStack_1018 = *(undefined8 *)(*pauVar5 + 8);
  uStack_1010 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_1008 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0xf;
  local_800 = *(undefined8 *)*pauVar4;
  uStack_7f8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_7f0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_7e8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x30;
  local_820 = *(undefined8 *)*pauVar5;
  uStack_818 = *(undefined8 *)(*pauVar5 + 8);
  uStack_810 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_808 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x10;
  local_1040 = *(undefined8 *)*pauVar4;
  uStack_1038 = *(undefined8 *)(*pauVar4 + 8);
  uStack_1030 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_1028 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x2f;
  local_1060 = *(undefined8 *)*pauVar5;
  uStack_1058 = *(undefined8 *)(*pauVar5 + 8);
  uStack_1050 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_1048 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x10;
  local_840 = *(undefined8 *)*pauVar4;
  uStack_838 = *(undefined8 *)(*pauVar4 + 8);
  uStack_830 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_828 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x2f;
  local_860 = *(undefined8 *)*pauVar5;
  uStack_858 = *(undefined8 *)(*pauVar5 + 8);
  uStack_850 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_848 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x11;
  local_1080 = *(undefined8 *)*pauVar4;
  uStack_1078 = *(undefined8 *)(*pauVar4 + 8);
  uStack_1070 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_1068 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x2e;
  local_10a0 = *(undefined8 *)*pauVar5;
  uStack_1098 = *(undefined8 *)(*pauVar5 + 8);
  uStack_1090 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_1088 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x11;
  local_880 = *(undefined8 *)*pauVar4;
  uStack_878 = *(undefined8 *)(*pauVar4 + 8);
  uStack_870 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_868 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x2e;
  local_8a0 = *(undefined8 *)*pauVar5;
  uStack_898 = *(undefined8 *)(*pauVar5 + 8);
  uStack_890 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_888 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x12;
  local_10c0 = *(undefined8 *)*pauVar4;
  uStack_10b8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_10b0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_10a8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x2d;
  local_10e0 = *(undefined8 *)*pauVar5;
  uStack_10d8 = *(undefined8 *)(*pauVar5 + 8);
  uStack_10d0 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_10c8 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x12;
  local_8c0 = *(undefined8 *)*pauVar4;
  uStack_8b8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_8b0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_8a8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x2d;
  local_8e0 = *(undefined8 *)*pauVar5;
  uStack_8d8 = *(undefined8 *)(*pauVar5 + 8);
  uStack_8d0 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_8c8 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x13;
  local_1100 = *(undefined8 *)*pauVar4;
  uStack_10f8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_10f0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_10e8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x2c;
  local_1120 = *(undefined8 *)*pauVar5;
  uStack_1118 = *(undefined8 *)(*pauVar5 + 8);
  uStack_1110 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_1108 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x13;
  local_900 = *(undefined8 *)*pauVar4;
  uStack_8f8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_8f0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_8e8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x2c;
  local_920 = *(undefined8 *)*pauVar5;
  uStack_918 = *(undefined8 *)(*pauVar5 + 8);
  uStack_910 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_908 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x14;
  local_1140 = *(undefined8 *)*pauVar4;
  uStack_1138 = *(undefined8 *)(*pauVar4 + 8);
  uStack_1130 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_1128 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x2b;
  local_1160 = *(undefined8 *)*pauVar5;
  uStack_1158 = *(undefined8 *)(*pauVar5 + 8);
  uStack_1150 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_1148 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x14;
  local_940 = *(undefined8 *)*pauVar4;
  uStack_938 = *(undefined8 *)(*pauVar4 + 8);
  uStack_930 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_928 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x2b;
  local_960 = *(undefined8 *)*pauVar5;
  uStack_958 = *(undefined8 *)(*pauVar5 + 8);
  uStack_950 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_948 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x15;
  local_1180 = *(undefined8 *)*pauVar4;
  uStack_1178 = *(undefined8 *)(*pauVar4 + 8);
  uStack_1170 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_1168 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x2a;
  local_11a0 = *(undefined8 *)*pauVar5;
  uStack_1198 = *(undefined8 *)(*pauVar5 + 8);
  uStack_1190 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_1188 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x15;
  local_980 = *(undefined8 *)*pauVar4;
  uStack_978 = *(undefined8 *)(*pauVar4 + 8);
  uStack_970 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_968 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x2a;
  local_9a0 = *(undefined8 *)*pauVar5;
  uStack_998 = *(undefined8 *)(*pauVar5 + 8);
  uStack_990 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_988 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x16;
  local_11c0 = *(undefined8 *)*pauVar4;
  uStack_11b8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_11b0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_11a8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x29;
  local_11e0 = *(undefined8 *)*pauVar5;
  uStack_11d8 = *(undefined8 *)(*pauVar5 + 8);
  uStack_11d0 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_11c8 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x16;
  local_9c0 = *(undefined8 *)*pauVar4;
  uStack_9b8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_9b0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_9a8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x29;
  local_9e0 = *(undefined8 *)*pauVar5;
  uStack_9d8 = *(undefined8 *)(*pauVar5 + 8);
  uStack_9d0 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_9c8 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x17;
  local_1200 = *(undefined8 *)*pauVar4;
  uStack_11f8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_11f0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_11e8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x28;
  local_1220 = *(undefined8 *)*pauVar5;
  uStack_1218 = *(undefined8 *)(*pauVar5 + 8);
  uStack_1210 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_1208 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x17;
  local_a00 = *(undefined8 *)*pauVar4;
  uStack_9f8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_9f0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_9e8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x28;
  local_a20 = *(undefined8 *)*pauVar5;
  uStack_a18 = *(undefined8 *)(*pauVar5 + 8);
  uStack_a10 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_a08 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x18;
  local_1240 = *(undefined8 *)*pauVar4;
  uStack_1238 = *(undefined8 *)(*pauVar4 + 8);
  uStack_1230 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_1228 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x27;
  local_1260 = *(undefined8 *)*pauVar5;
  uStack_1258 = *(undefined8 *)(*pauVar5 + 8);
  uStack_1250 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_1248 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x18;
  local_a40 = *(undefined8 *)*pauVar4;
  uStack_a38 = *(undefined8 *)(*pauVar4 + 8);
  uStack_a30 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_a28 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x27;
  local_a60 = *(undefined8 *)*pauVar5;
  uStack_a58 = *(undefined8 *)(*pauVar5 + 8);
  uStack_a50 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_a48 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x19;
  local_1280 = *(undefined8 *)*pauVar4;
  uStack_1278 = *(undefined8 *)(*pauVar4 + 8);
  uStack_1270 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_1268 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x26;
  local_12a0 = *(undefined8 *)*pauVar5;
  uStack_1298 = *(undefined8 *)(*pauVar5 + 8);
  uStack_1290 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_1288 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x19;
  local_a80 = *(undefined8 *)*pauVar4;
  uStack_a78 = *(undefined8 *)(*pauVar4 + 8);
  uStack_a70 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_a68 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x26;
  local_aa0 = *(undefined8 *)*pauVar5;
  uStack_a98 = *(undefined8 *)(*pauVar5 + 8);
  uStack_a90 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_a88 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x1a;
  local_12c0 = *(undefined8 *)*pauVar4;
  uStack_12b8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_12b0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_12a8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x25;
  local_12e0 = *(undefined8 *)*pauVar5;
  uStack_12d8 = *(undefined8 *)(*pauVar5 + 8);
  uStack_12d0 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_12c8 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x1a;
  local_ac0 = *(undefined8 *)*pauVar4;
  uStack_ab8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_ab0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_aa8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x25;
  local_ae0 = *(undefined8 *)*pauVar5;
  uStack_ad8 = *(undefined8 *)(*pauVar5 + 8);
  uStack_ad0 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_ac8 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x1b;
  local_1300 = *(undefined8 *)*pauVar4;
  uStack_12f8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_12f0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_12e8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x24;
  local_1320 = *(undefined8 *)*pauVar5;
  uStack_1318 = *(undefined8 *)(*pauVar5 + 8);
  uStack_1310 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_1308 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x1b;
  local_b00 = *(undefined8 *)*pauVar4;
  uStack_af8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_af0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_ae8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x24;
  local_b20 = *(undefined8 *)*pauVar5;
  uStack_b18 = *(undefined8 *)(*pauVar5 + 8);
  uStack_b10 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_b08 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x1c;
  local_1340 = *(undefined8 *)*pauVar4;
  uStack_1338 = *(undefined8 *)(*pauVar4 + 8);
  uStack_1330 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_1328 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x23;
  local_1360 = *(undefined8 *)*pauVar5;
  uStack_1358 = *(undefined8 *)(*pauVar5 + 8);
  uStack_1350 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_1348 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x1c;
  local_b40 = *(undefined8 *)*pauVar4;
  uStack_b38 = *(undefined8 *)(*pauVar4 + 8);
  uStack_b30 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_b28 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x23;
  local_b60 = *(undefined8 *)*pauVar5;
  uStack_b58 = *(undefined8 *)(*pauVar5 + 8);
  uStack_b50 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_b48 = *(undefined8 *)(*pauVar5 + 0x18);
  vpsubd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x1d;
  local_1380 = *(undefined8 *)*pauVar4;
  uStack_1378 = *(undefined8 *)(*pauVar4 + 8);
  uStack_1370 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_1368 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x22;
  local_13a0 = *(undefined8 *)*pauVar5;
  uStack_1398 = *(undefined8 *)(*pauVar5 + 8);
  uStack_1390 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_1388 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x1d;
  local_b80 = *(undefined8 *)*pauVar4;
  uStack_b78 = *(undefined8 *)(*pauVar4 + 8);
  uStack_b70 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_b68 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x22;
  local_ba0 = *(undefined8 *)*pauVar5;
  uStack_b98 = *(undefined8 *)(*pauVar5 + 8);
  uStack_b90 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_b88 = *(undefined8 *)(*pauVar5 + 0x18);
  auVar3 = vpsubd_avx2(*pauVar4,*pauVar5);
  auVar11 = auVar3._0_24_;
  pauVar4 = local_1468 + local_1478 * 0x1e;
  local_13c0 = *(undefined8 *)*pauVar4;
  uStack_13b8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_13b0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_13a8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x21;
  local_13e0 = *(undefined8 *)*pauVar5;
  uStack_13d8 = *(undefined8 *)(*pauVar5 + 8);
  uStack_13d0 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_13c8 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x1e;
  local_bc0 = *(undefined8 *)*pauVar4;
  uStack_bb8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_bb0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_ba8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x21;
  local_be0 = *(undefined8 *)*pauVar5;
  uStack_bd8 = *(undefined8 *)(*pauVar5 + 8);
  uStack_bd0 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_bc8 = *(undefined8 *)(*pauVar5 + 0x18);
  auVar3 = vpsubd_avx2(*pauVar4,*pauVar5);
  Var10 = auVar3._23_9_;
  pauVar4 = local_1468 + local_1478 * 0x1f;
  local_1400 = *(undefined8 *)*pauVar4;
  uStack_13f8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_13f0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_13e8 = *(undefined8 *)(*pauVar4 + 0x18);
  pauVar5 = local_1468 + local_1478 * 0x20;
  local_1420 = *(undefined8 *)*pauVar5;
  uStack_1418 = *(undefined8 *)(*pauVar5 + 8);
  uStack_1410 = *(undefined8 *)(*pauVar5 + 0x10);
  uStack_1408 = *(undefined8 *)(*pauVar5 + 0x18);
  vpaddd_avx2(*pauVar4,*pauVar5);
  pauVar4 = local_1468 + local_1478 * 0x1f;
  local_c00 = *(undefined8 *)*pauVar4;
  uStack_bf8 = *(undefined8 *)(*pauVar4 + 8);
  uStack_bf0 = *(undefined8 *)(*pauVar4 + 0x10);
  uStack_be8 = *(undefined8 *)(*pauVar4 + 0x18);
  local_1468 = local_1468 + local_1478 * 0x20;
  local_c20 = *(undefined8 *)*local_1468;
  uStack_c18 = *(undefined8 *)(*local_1468 + 8);
  uStack_c10 = *(undefined8 *)(*local_1468 + 0x10);
  uStack_c08 = *(undefined8 *)(*local_1468 + 0x18);
  vpsubd_avx2(*pauVar4,*local_1468);
  local_400 = local_1424;
  local_3fc = local_1424;
  local_3f8 = local_1424;
  local_3f4 = local_1424;
  local_3f0 = local_1424;
  local_3ec = local_1424;
  local_3e8 = local_1424;
  local_3e4 = local_1424;
  local_3c0 = local_1428;
  local_3bc = local_1428;
  local_3b8 = local_1428;
  local_3b4 = local_1428;
  local_3b0 = local_1428;
  local_3ac = local_1428;
  local_3a8 = local_1428;
  local_3a4 = local_1428;
  local_380 = local_142c;
  local_37c = local_142c;
  local_378 = local_142c;
  local_374 = local_142c;
  local_370 = local_142c;
  local_36c = local_142c;
  local_368 = local_142c;
  local_364 = local_142c;
  local_340 = local_1430;
  local_33c = local_1430;
  local_338 = local_1430;
  local_334 = local_1430;
  local_330 = local_1430;
  local_32c = local_1430;
  local_328 = local_1430;
  local_324 = local_1430;
  local_300 = local_1434;
  local_2fc = local_1434;
  local_2f8 = local_1434;
  local_2f4 = local_1434;
  local_2f0 = local_1434;
  local_2ec = local_1434;
  local_2e8 = local_1434;
  local_2e4 = local_1434;
  local_2c0 = local_1438;
  local_2bc = local_1438;
  local_2b8 = local_1438;
  local_2b4 = local_1438;
  local_2b0 = local_1438;
  local_2ac = local_1438;
  local_2a8 = local_1438;
  local_2a4 = local_1438;
  local_280 = local_143c;
  local_27c = local_143c;
  local_278 = local_143c;
  local_274 = local_143c;
  local_270 = local_143c;
  local_26c = local_143c;
  local_268 = local_143c;
  local_264 = local_143c;
  local_240 = local_1440;
  local_23c = local_1440;
  local_238 = local_1440;
  local_234 = local_1440;
  local_230 = local_1440;
  local_22c = local_1440;
  local_228 = local_1440;
  local_224 = local_1440;
  local_200 = local_1444;
  local_1fc = local_1444;
  local_1f8 = local_1444;
  local_1f4 = local_1444;
  local_1f0 = local_1444;
  local_1ec = local_1444;
  local_1e8 = local_1444;
  local_1e4 = local_1444;
  local_1c0 = local_1448;
  local_1bc = local_1448;
  local_1b8 = local_1448;
  local_1b4 = local_1448;
  local_1b0 = local_1448;
  local_1ac = local_1448;
  local_1a8 = local_1448;
  local_1a4 = local_1448;
  local_180 = local_144c;
  local_17c = local_144c;
  local_178 = local_144c;
  local_174 = local_144c;
  local_170 = local_144c;
  local_16c = local_144c;
  local_168 = local_144c;
  local_164 = local_144c;
  local_140 = local_1450;
  local_13c = local_1450;
  local_138 = local_1450;
  local_134 = local_1450;
  local_130 = local_1450;
  local_12c = local_1450;
  local_128 = local_1450;
  local_124 = local_1450;
  local_100 = local_1454;
  local_fc = local_1454;
  local_f8 = local_1454;
  local_f4 = local_1454;
  local_f0 = local_1454;
  local_ec = local_1454;
  local_e8 = local_1454;
  local_e4 = local_1454;
  local_c0 = local_1458;
  local_bc = local_1458;
  local_b8 = local_1458;
  local_b4 = local_1458;
  local_b0 = local_1458;
  local_ac = local_1458;
  local_a8 = local_1458;
  local_a4 = local_1458;
  local_78 = local_145c;
  local_74 = local_145c;
  local_70 = local_145c;
  local_6c = local_145c;
  local_68 = local_145c;
  local_64 = local_145c;
  local_60 = local_145c;
  local_5c = local_145c;
  fdct64_stage2_avx2(in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28,in_stack_ffffffffffffdd20,
                     in_stack_ffffffffffffdd18,in_stack_ffffffffffffdd10,in_stack_ffffffffffffdd0f);
  fdct64_stage3_avx2(in_stack_ffffffffffffdb30,in_stack_ffffffffffffdb28,in_stack_ffffffffffffdb20,
                     in_stack_ffffffffffffdb18,in_stack_ffffffffffffdb10,in_stack_ffffffffffffdb0f);
  palVar7 = (__m256i *)CONCAT44(uVar8,(int)local_1471);
  fdct64_stage4_avx2(in_stack_ffffffffffffde30,in_stack_ffffffffffffde28,in_stack_ffffffffffffde20,
                     in_stack_ffffffffffffde18,in_stack_ffffffffffffde10,in_stack_ffffffffffffde08,
                     (__m256i *)&local_14c0,palVar7,in_stack_ffffffffffffd918);
  fdct64_stage5_avx2(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,
                     in_stack_ffffffffffffdb98,in_stack_ffffffffffffdb90,in_stack_ffffffffffffdb88,
                     (__m256i *)&local_14c0,
                     (__m256i *)CONCAT44((int)((ulong)palVar7 >> 0x20),(int)local_1471),
                     in_stack_ffffffffffffd918);
  palVar7 = (__m256i *)&local_1620;
  cospi_p24_00 = (__m256i *)&local_1640;
  fdct64_stage6_avx2(in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20,
                     in_stack_ffffffffffffdf18,in_stack_ffffffffffffdf10,in_stack_ffffffffffffdf08,
                     (__m256i *)&local_15a0,(__m256i *)&local_15c0,(__m256i *)&local_15e0,
                     (__m256i *)&local_1600,palVar7,cospi_p24_00,(__m256i *)&local_14c0,
                     (__m256i *)CONCAT44(in_stack_ffffffffffffd944,(int)local_1471),
                     in_stack_ffffffffffffd948);
  fdct64_stage7_avx2(in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc28,in_stack_ffffffffffffdc20,
                     in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc10,in_stack_ffffffffffffdc08,
                     (__m256i *)&local_15e0,(__m256i *)&local_1600,(__m256i *)&local_1640,
                     (__m256i *)&local_14c0,
                     (__m256i *)CONCAT44((int)((ulong)palVar7 >> 0x20),(int)local_1471),
                     (int8_t)cospi_p24_00);
  fdct64_stage8_avx2(auVar9._16_8_,auVar9._8_8_,auVar9._0_8_,in_stack_ffffffffffffe158,
                     in_stack_ffffffffffffe157);
  fdct64_stage9_avx2(in_stack_ffffffffffffdf70,in_stack_ffffffffffffdf68,in_stack_ffffffffffffdf60,
                     in_stack_ffffffffffffdf58,in_stack_ffffffffffffdf57);
  fdct64_stage10_avx2(auVar11._16_8_,auVar11._8_8_,auVar11._0_8_,(__m256i *)((unkuint9)Var10 >> 8),
                      (int8_t)Var10);
  *local_1470 = local_26a0;
  local_1470[1] = uStack_2698;
  local_1470[2] = uStack_2690;
  local_1470[3] = uStack_2688;
  puVar6 = local_1470 + (long)(local_147c * 0x3f) * 4;
  *puVar6 = local_1ec0;
  puVar6[1] = uStack_1eb8;
  puVar6[2] = CONCAT17(in_stack_ffffffffffffe157,uStack_1eb0);
  puVar6[3] = in_stack_ffffffffffffe158;
  puVar6 = local_1470 + (long)local_147c * 4;
  *puVar6 = local_22a0;
  puVar6[1] = uStack_2298;
  puVar6[2] = uStack_2290;
  puVar6[3] = uStack_2288;
  puVar6 = local_1470 + (long)(local_147c * 0x3e) * 4;
  *puVar6 = local_22c0;
  puVar6[1] = uStack_22b8;
  puVar6[2] = uStack_22b0;
  puVar6[3] = uStack_22a8;
  puVar6 = local_1470 + (long)(local_147c * 2) * 4;
  *puVar6 = local_24a0;
  puVar6[1] = uStack_2498;
  puVar6[2] = uStack_2490;
  puVar6[3] = uStack_2488;
  puVar6 = local_1470 + (long)(local_147c * 0x3d) * 4;
  *puVar6 = local_20c0;
  puVar6[1] = uStack_20b8;
  puVar6[2] = CONCAT17(in_stack_ffffffffffffdf57,uStack_20b0);
  puVar6[3] = in_stack_ffffffffffffdf58;
  puVar6 = local_1470 + (long)(local_147c * 3) * 4;
  *puVar6 = in_stack_ffffffffffffdf60;
  puVar6[1] = in_stack_ffffffffffffdf68;
  puVar6[2] = in_stack_ffffffffffffdf70;
  puVar6[3] = uStack_2088;
  puVar6 = local_1470 + (long)(local_147c * 0x3c) * 4;
  *puVar6 = local_24c0;
  puVar6[1] = uStack_24b8;
  puVar6[2] = uStack_24b0;
  puVar6[3] = uStack_24a8;
  puVar6 = local_1470 + (long)(local_147c * 4) * 4;
  *puVar6 = local_25a0;
  puVar6[1] = uStack_2598;
  puVar6[2] = uStack_2590;
  puVar6[3] = uStack_2588;
  puVar6 = local_1470 + (long)(local_147c * 0x3b) * 4;
  *puVar6 = local_1fc0;
  puVar6[1] = uStack_1fb8;
  puVar6[2] = uStack_1fb0;
  puVar6[3] = uStack_1fa8;
  puVar6 = local_1470 + (long)(local_147c * 5) * 4;
  *puVar6 = local_21a0;
  puVar6[1] = uStack_2198;
  puVar6[2] = uStack_2190;
  puVar6[3] = uStack_2188;
  puVar6 = local_1470 + (long)(local_147c * 0x3a) * 4;
  *puVar6 = local_23c0;
  puVar6[1] = uStack_23b8;
  puVar6[2] = uStack_23b0;
  puVar6[3] = uStack_23a8;
  puVar6 = local_1470 + (long)(local_147c * 6) * 4;
  *puVar6 = local_23a0;
  puVar6[1] = uStack_2398;
  puVar6[2] = uStack_2390;
  puVar6[3] = uStack_2388;
  puVar6 = local_1470 + (long)(local_147c * 0x39) * 4;
  *puVar6 = local_21c0;
  puVar6[1] = uStack_21b8;
  puVar6[2] = uStack_21b0;
  puVar6[3] = uStack_21a8;
  puVar6 = local_1470 + (long)(local_147c * 7) * 4;
  *puVar6 = local_1fa0;
  puVar6[1] = uStack_1f98;
  puVar6[2] = uStack_1f90;
  puVar6[3] = uStack_1f88;
  puVar6 = local_1470 + (long)(local_147c * 0x38) * 4;
  *puVar6 = local_25c0;
  puVar6[1] = uStack_25b8;
  puVar6[2] = uStack_25b0;
  puVar6[3] = uStack_25a8;
  puVar6 = local_1470 + (long)(local_147c * 8) * 4;
  *puVar6 = local_2620;
  puVar6[1] = uStack_2618;
  puVar6[2] = uStack_2610;
  puVar6[3] = uStack_2608;
  puVar6 = local_1470 + (long)(local_147c * 0x37) * 4;
  *puVar6 = local_1f40;
  puVar6[1] = uStack_1f38;
  puVar6[2] = uStack_1f30;
  puVar6[3] = uStack_1f28;
  puVar6 = local_1470 + (long)(local_147c * 9) * 4;
  *puVar6 = local_2220;
  puVar6[1] = uStack_2218;
  puVar6[2] = uStack_2210;
  puVar6[3] = uStack_2208;
  puVar6 = local_1470 + (long)(local_147c * 0x36) * 4;
  *puVar6 = local_2340;
  puVar6[1] = uStack_2338;
  puVar6[2] = uStack_2330;
  puVar6[3] = uStack_2328;
  puVar6 = local_1470 + (long)(local_147c * 10) * 4;
  *puVar6 = local_2420;
  puVar6[1] = uStack_2418;
  puVar6[2] = uStack_2410;
  puVar6[3] = uStack_2408;
  puVar6 = local_1470 + (long)(local_147c * 0x35) * 4;
  *puVar6 = local_2140;
  puVar6[1] = uStack_2138;
  puVar6[2] = uStack_2130;
  puVar6[3] = uStack_2128;
  puVar6 = local_1470 + (long)(local_147c * 0xb) * 4;
  *puVar6 = local_2020;
  puVar6[1] = uStack_2018;
  puVar6[2] = uStack_2010;
  puVar6[3] = uStack_2008;
  puVar6 = local_1470 + (long)(local_147c * 0x34) * 4;
  *puVar6 = local_2540;
  puVar6[1] = uStack_2538;
  puVar6[2] = uStack_2530;
  puVar6[3] = uStack_2528;
  puVar6 = local_1470 + (long)(local_147c * 0xc) * 4;
  *puVar6 = local_2520;
  puVar6[1] = uStack_2518;
  puVar6[2] = uStack_2510;
  puVar6[3] = uStack_2508;
  puVar6 = local_1470 + (long)(local_147c * 0x33) * 4;
  *puVar6 = local_2040;
  puVar6[1] = uStack_2038;
  puVar6[2] = uStack_2030;
  puVar6[3] = uStack_2028;
  puVar6 = local_1470 + (long)(local_147c * 0xd) * 4;
  *puVar6 = local_2120;
  puVar6[1] = uStack_2118;
  puVar6[2] = uStack_2110;
  puVar6[3] = uStack_2108;
  puVar6 = local_1470 + (long)(local_147c * 0x32) * 4;
  *puVar6 = local_2440;
  puVar6[1] = uStack_2438;
  puVar6[2] = uStack_2430;
  puVar6[3] = uStack_2428;
  puVar6 = local_1470 + (long)(local_147c * 0xe) * 4;
  *puVar6 = local_2320;
  puVar6[1] = uStack_2318;
  puVar6[2] = uStack_2310;
  puVar6[3] = uStack_2308;
  puVar6 = local_1470 + (long)(local_147c * 0x31) * 4;
  *puVar6 = local_2240;
  puVar6[1] = uStack_2238;
  puVar6[2] = uStack_2230;
  puVar6[3] = uStack_2228;
  puVar6 = local_1470 + (long)(local_147c * 0xf) * 4;
  *puVar6 = local_1f20;
  puVar6[1] = uStack_1f18;
  puVar6[2] = uStack_1f10;
  puVar6[3] = uStack_1f08;
  puVar6 = local_1470 + (long)(local_147c * 0x30) * 4;
  *puVar6 = local_2640;
  puVar6[1] = uStack_2638;
  puVar6[2] = uStack_2630;
  puVar6[3] = uStack_2628;
  puVar6 = local_1470 + (long)(local_147c * 0x10) * 4;
  *puVar6 = local_2660;
  puVar6[1] = uStack_2658;
  puVar6[2] = uStack_2650;
  puVar6[3] = uStack_2648;
  puVar6 = local_1470 + (long)(local_147c * 0x2f) * 4;
  *puVar6 = local_1f00;
  puVar6[1] = uStack_1ef8;
  puVar6[2] = uStack_1ef0;
  puVar6[3] = uStack_1ee8;
  puVar6 = local_1470 + (long)(local_147c * 0x11) * 4;
  *puVar6 = local_2260;
  puVar6[1] = uStack_2258;
  puVar6[2] = uStack_2250;
  puVar6[3] = uStack_2248;
  puVar6 = local_1470 + (long)(local_147c * 0x2e) * 4;
  *puVar6 = local_2300;
  puVar6[1] = CONCAT17(in_stack_ffffffffffffdd0f,uStack_22f8);
  puVar6[2] = in_stack_ffffffffffffdd10;
  puVar6[3] = in_stack_ffffffffffffdd18;
  puVar6 = local_1470 + (long)(local_147c * 0x12) * 4;
  *puVar6 = in_stack_ffffffffffffdba0;
  puVar6[1] = in_stack_ffffffffffffdba8;
  puVar6[2] = in_stack_ffffffffffffdbb0;
  puVar6[3] = uStack_2448;
  puVar6 = local_1470 + (long)(local_147c * 0x2d) * 4;
  *puVar6 = local_2100;
  puVar6[1] = in_stack_ffffffffffffdf08;
  puVar6[2] = in_stack_ffffffffffffdf10;
  puVar6[3] = in_stack_ffffffffffffdf18;
  puVar6 = local_1470 + (long)(local_147c * 0x13) * 4;
  *puVar6 = local_2060;
  puVar6[1] = uStack_2058;
  puVar6[2] = uStack_2050;
  puVar6[3] = uStack_2048;
  puVar6 = local_1470 + (long)(local_147c * 0x2c) * 4;
  *puVar6 = local_2500;
  puVar6[1] = CONCAT17(in_stack_ffffffffffffdb0f,uStack_24f8);
  puVar6[2] = in_stack_ffffffffffffdb10;
  puVar6[3] = in_stack_ffffffffffffdb18;
  puVar6 = local_1470 + (long)(local_147c * 0x14) * 4;
  *puVar6 = local_2560;
  puVar6[1] = uStack_2558;
  puVar6[2] = uStack_2550;
  puVar6[3] = uStack_2548;
  puVar6 = local_1470 + (long)(local_147c * 0x2b) * 4;
  *puVar6 = local_2000;
  puVar6[1] = uStack_1ff8;
  puVar6[2] = uStack_1ff0;
  puVar6[3] = uStack_1fe8;
  puVar6 = local_1470 + (long)(local_147c * 0x15) * 4;
  *puVar6 = local_2160;
  puVar6[1] = uStack_2158;
  puVar6[2] = uStack_2150;
  puVar6[3] = uStack_2148;
  puVar6 = local_1470 + (long)(local_147c * 0x2a) * 4;
  *puVar6 = local_2400;
  puVar6[1] = in_stack_ffffffffffffdc08;
  puVar6[2] = in_stack_ffffffffffffdc10;
  puVar6[3] = in_stack_ffffffffffffdc18;
  puVar6 = local_1470 + (long)(local_147c * 0x16) * 4;
  *puVar6 = local_2360;
  puVar6[1] = uStack_2358;
  puVar6[2] = uStack_2350;
  puVar6[3] = uStack_2348;
  puVar6 = local_1470 + (long)(local_147c * 0x29) * 4;
  *puVar6 = local_2200;
  puVar6[1] = in_stack_ffffffffffffde08;
  puVar6[2] = in_stack_ffffffffffffde10;
  puVar6[3] = in_stack_ffffffffffffde18;
  puVar6 = local_1470 + (long)(local_147c * 0x17) * 4;
  *puVar6 = local_1f60;
  puVar6[1] = uStack_1f58;
  puVar6[2] = uStack_1f50;
  puVar6[3] = uStack_1f48;
  puVar6 = local_1470 + (long)(local_147c * 0x28) * 4;
  *puVar6 = local_2600;
  puVar6[1] = uStack_25f8;
  puVar6[2] = uStack_25f0;
  puVar6[3] = uStack_25e8;
  puVar6 = local_1470 + (long)(local_147c * 0x18) * 4;
  *puVar6 = local_25e0;
  puVar6[1] = uStack_25d8;
  puVar6[2] = uStack_25d0;
  puVar6[3] = uStack_25c8;
  puVar6 = local_1470 + (long)(local_147c * 0x27) * 4;
  *puVar6 = local_1f80;
  puVar6[1] = uStack_1f78;
  puVar6[2] = uStack_1f70;
  puVar6[3] = uStack_1f68;
  puVar6 = local_1470 + (long)(local_147c * 0x19) * 4;
  *puVar6 = in_stack_ffffffffffffde20;
  puVar6[1] = in_stack_ffffffffffffde28;
  puVar6[2] = in_stack_ffffffffffffde30;
  puVar6[3] = uStack_21c8;
  puVar6 = local_1470 + (long)(local_147c * 0x26) * 4;
  *puVar6 = local_2380;
  puVar6[1] = uStack_2378;
  puVar6[2] = uStack_2370;
  puVar6[3] = uStack_2368;
  puVar6 = local_1470 + (long)(local_147c * 0x1a) * 4;
  *puVar6 = in_stack_ffffffffffffdc20;
  puVar6[1] = in_stack_ffffffffffffdc28;
  puVar6[2] = in_stack_ffffffffffffdc30;
  puVar6[3] = uStack_23c8;
  puVar6 = local_1470 + (long)(local_147c * 0x25) * 4;
  *puVar6 = local_2180;
  puVar6[1] = uStack_2178;
  puVar6[2] = uStack_2170;
  puVar6[3] = uStack_2168;
  puVar6 = local_1470 + (long)(local_147c * 0x1b) * 4;
  *puVar6 = local_1fe0;
  puVar6[1] = uStack_1fd8;
  puVar6[2] = uStack_1fd0;
  puVar6[3] = uStack_1fc8;
  puVar6 = local_1470 + (long)(local_147c * 0x24) * 4;
  *puVar6 = local_2580;
  puVar6[1] = uStack_2578;
  puVar6[2] = uStack_2570;
  puVar6[3] = uStack_2568;
  puVar6 = local_1470 + (long)(local_147c * 0x1c) * 4;
  *puVar6 = in_stack_ffffffffffffdb20;
  puVar6[1] = in_stack_ffffffffffffdb28;
  puVar6[2] = in_stack_ffffffffffffdb30;
  puVar6[3] = uStack_24c8;
  puVar6 = local_1470 + (long)(local_147c * 0x23) * 4;
  *puVar6 = local_2080;
  puVar6[1] = uStack_2078;
  puVar6[2] = uStack_2070;
  puVar6[3] = uStack_2068;
  puVar6 = local_1470 + (long)(local_147c * 0x1d) * 4;
  *puVar6 = in_stack_ffffffffffffdf20;
  puVar6[1] = in_stack_ffffffffffffdf28;
  puVar6[2] = in_stack_ffffffffffffdf30;
  puVar6[3] = uStack_20c8;
  puVar6 = local_1470 + (long)(local_147c * 0x22) * 4;
  *puVar6 = local_2480;
  puVar6[1] = in_stack_ffffffffffffdb88;
  puVar6[2] = in_stack_ffffffffffffdb90;
  puVar6[3] = in_stack_ffffffffffffdb98;
  puVar6 = local_1470 + (long)(local_147c * 0x1e) * 4;
  *puVar6 = in_stack_ffffffffffffdd20;
  puVar6[1] = in_stack_ffffffffffffdd28;
  puVar6[2] = in_stack_ffffffffffffdd30;
  puVar6[3] = uStack_22c8;
  puVar6 = local_1470 + (long)(local_147c * 0x21) * 4;
  *puVar6 = local_2280;
  puVar6[1] = uStack_2278;
  puVar6[2] = uStack_2270;
  puVar6[3] = uStack_2268;
  puVar6 = local_1470 + (long)(local_147c * 0x1f) * 4;
  *puVar6 = local_1ee0;
  puVar6[1] = uStack_1ed8;
  puVar6[2] = uStack_1ed0;
  puVar6[3] = uStack_1ec8;
  local_1470 = local_1470 + (long)(local_147c * 0x20) * 4;
  *local_1470 = local_2680;
  local_1470[1] = uStack_2678;
  local_1470[2] = uStack_2670;
  local_1470[3] = uStack_2668;
  return;
}

Assistant:

static void fdct64_avx2(__m256i *input, __m256i *output, int8_t cos_bit,
                        const int instride, const int outstride) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i __rounding = _mm256_set1_epi32(1 << (cos_bit - 1));
  __m256i cospi_m32 = _mm256_set1_epi32(-cospi[32]);
  __m256i cospi_p32 = _mm256_set1_epi32(cospi[32]);
  __m256i cospi_m16 = _mm256_set1_epi32(-cospi[16]);
  __m256i cospi_p48 = _mm256_set1_epi32(cospi[48]);
  __m256i cospi_m48 = _mm256_set1_epi32(-cospi[48]);
  __m256i cospi_p16 = _mm256_set1_epi32(cospi[16]);
  __m256i cospi_m08 = _mm256_set1_epi32(-cospi[8]);
  __m256i cospi_p56 = _mm256_set1_epi32(cospi[56]);
  __m256i cospi_m56 = _mm256_set1_epi32(-cospi[56]);
  __m256i cospi_m40 = _mm256_set1_epi32(-cospi[40]);
  __m256i cospi_p24 = _mm256_set1_epi32(cospi[24]);
  __m256i cospi_m24 = _mm256_set1_epi32(-cospi[24]);
  __m256i cospi_p08 = _mm256_set1_epi32(cospi[8]);
  __m256i cospi_p40 = _mm256_set1_epi32(cospi[40]);

  int startidx = 0 * instride;
  int endidx = 63 * instride;
  // stage 1
  __m256i x1[64];
  x1[0] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[63] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[1] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[62] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[2] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[61] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[3] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[60] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[4] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[59] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[5] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[58] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[6] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[57] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[7] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[56] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[8] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[55] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[9] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[54] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[10] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[53] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[11] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[52] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[12] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[51] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[13] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[50] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[14] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[49] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[15] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[48] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[16] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[47] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[17] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[46] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[18] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[45] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[19] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[44] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[20] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[43] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[21] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[42] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[22] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[41] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[23] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[40] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[24] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[39] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[25] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[38] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[26] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[37] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[27] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[36] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[28] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[35] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[29] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[34] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[30] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[33] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[31] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[32] = _mm256_sub_epi32(input[startidx], input[endidx]);

  // stage 2
  __m256i x2[64];
  fdct64_stage2_avx2(x1, x2, &cospi_m32, &cospi_p32, &__rounding, cos_bit);
  // stage 3
  fdct64_stage3_avx2(x2, x1, &cospi_m32, &cospi_p32, &__rounding, cos_bit);
  // stage 4
  fdct64_stage4_avx2(x1, x2, &cospi_m32, &cospi_p32, &cospi_m16, &cospi_p48,
                     &cospi_m48, &__rounding, cos_bit);
  // stage 5
  fdct64_stage5_avx2(x2, x1, &cospi_m32, &cospi_p32, &cospi_m16, &cospi_p48,
                     &cospi_m48, &__rounding, cos_bit);
  // stage 6
  fdct64_stage6_avx2(x1, x2, &cospi_p16, &cospi_p32, &cospi_m16, &cospi_p48,
                     &cospi_m48, &cospi_m08, &cospi_p56, &cospi_m56, &cospi_m40,
                     &cospi_p24, &cospi_m24, &__rounding, cos_bit);
  // stage 7
  fdct64_stage7_avx2(x2, x1, &cospi_p08, &cospi_p56, &cospi_p40, &cospi_p24,
                     &cospi_m08, &cospi_m56, &cospi_m40, &cospi_m24,
                     &__rounding, cos_bit);
  // stage 8
  fdct64_stage8_avx2(x1, x2, cospi, &__rounding, cos_bit);
  // stage 9
  fdct64_stage9_avx2(x2, x1, cospi, &__rounding, cos_bit);
  // stage 10
  fdct64_stage10_avx2(x1, x2, cospi, &__rounding, cos_bit);

  startidx = 0 * outstride;
  endidx = 63 * outstride;

  // stage 11
  output[startidx] = x2[0];
  output[endidx] = x2[63];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[32];
  output[endidx] = x2[31];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[16];
  output[endidx] = x2[47];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[48];
  output[endidx] = x2[15];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[8];
  output[endidx] = x2[55];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[40];
  output[endidx] = x2[23];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[24];
  output[endidx] = x2[39];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[56];
  output[endidx] = x2[7];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[4];
  output[endidx] = x2[59];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[36];
  output[endidx] = x2[27];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[20];
  output[endidx] = x2[43];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[52];
  output[endidx] = x2[11];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[12];
  output[endidx] = x2[51];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[44];
  output[endidx] = x2[19];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[28];
  output[endidx] = x2[35];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[60];
  output[endidx] = x2[3];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[2];
  output[endidx] = x2[61];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[34];
  output[endidx] = x2[29];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[18];
  output[endidx] = x2[45];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[50];
  output[endidx] = x2[13];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[10];
  output[endidx] = x2[53];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[42];
  output[endidx] = x2[21];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[26];
  output[endidx] = x2[37];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[58];
  output[endidx] = x2[5];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[6];
  output[endidx] = x2[57];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[38];
  output[endidx] = x2[25];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[22];
  output[endidx] = x2[41];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[54];
  output[endidx] = x2[9];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[14];
  output[endidx] = x2[49];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[46];
  output[endidx] = x2[17];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[30];
  output[endidx] = x2[33];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[62];
  output[endidx] = x2[1];
}